

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O0

void __thiscall
cppcms::url_dispatcher::map_generic(url_dispatcher *this,regex *re,generic_handler *h)

{
  generic_handler *h_00;
  value_type *in_RDI;
  shared_ptr<cppcms::(anonymous_namespace)::option> opt;
  generic_option *in_stack_ffffffffffffffa8;
  shared_ptr<cppcms::(anonymous_namespace)::option> *in_stack_ffffffffffffffb0;
  regex *in_stack_ffffffffffffffc8;
  generic_option *in_stack_ffffffffffffffd0;
  
  h_00 = (generic_handler *)operator_new(0x88);
  anon_unknown_0::generic_option::generic_option
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,h_00);
  std::shared_ptr<cppcms::(anonymous_namespace)::option>::
  shared_ptr<cppcms::(anonymous_namespace)::generic_option,void>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  booster::hold_ptr<cppcms::url_dispatcher::_data>::operator->
            ((hold_ptr<cppcms::url_dispatcher::_data> *)in_RDI);
  std::
  vector<std::shared_ptr<cppcms::(anonymous_namespace)::option>,_std::allocator<std::shared_ptr<cppcms::(anonymous_namespace)::option>_>_>
  ::push_back((vector<std::shared_ptr<cppcms::(anonymous_namespace)::option>,_std::allocator<std::shared_ptr<cppcms::(anonymous_namespace)::option>_>_>
               *)h_00,in_RDI);
  std::shared_ptr<cppcms::(anonymous_namespace)::option>::~shared_ptr
            ((shared_ptr<cppcms::(anonymous_namespace)::option> *)0x3b4132);
  return;
}

Assistant:

void url_dispatcher::map_generic(booster::regex const &re,generic_handler const &h)
	{
		booster::shared_ptr<option> opt(new generic_option(re,h));
		d->options.push_back(opt);
	}